

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O0

bool __thiscall COLLADASaxFWL::FormulasLoader::end__apply(FormulasLoader *this)

{
  value_type vVar1;
  bool bVar2;
  byte bVar3;
  size_type sVar4;
  reference pvVar5;
  undefined8 uVar6;
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *in_RDI;
  INode *node_3;
  INode *node_2;
  INode *node_1;
  INode *node;
  Operator op;
  size_t i;
  size_t numOfNodes;
  NodeVector nodes;
  INode **in_stack_ffffffffffffff28;
  ArrayPrimitiveType<MathML::AST::INode_*> *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  ArrayPrimitiveType<MathML::AST::INode_*> *in_stack_ffffffffffffff40;
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *__x;
  ulong local_50;
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> local_28;
  byte local_1;
  
  *(undefined1 *)
   ((long)&in_RDI[0xb].
           super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 1;
  bVar2 = std::
          stack<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>_>
          ::empty((stack<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>_>
                   *)0xb2696c);
  if (bVar2) {
    local_1 = 0;
  }
  else {
    __x = in_RDI + 1;
    std::
    stack<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>_>
    ::top((stack<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>_>
           *)0xb26992);
    std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::vector(in_RDI,__x);
    std::
    stack<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>_>
    ::pop((stack<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>_>
           *)0xb269ac);
    sVar4 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::size
                      (&local_28);
    if (sVar4 == 0) {
      local_1 = 0;
    }
    else {
      bVar2 = std::
              stack<COLLADASaxFWL::Operator,_std::deque<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>_>
              ::empty((stack<COLLADASaxFWL::Operator,_std::deque<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>_>
                       *)0xb26a1a);
      if (bVar2) {
        COLLADAFW::Formula::getMathmlAsts
                  ((Formula *)
                   (in_RDI->
                   super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::size(&local_28);
        COLLADAFW::ArrayPrimitiveType<MathML::AST::INode_*>::allocMemory
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                   (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
        for (local_50 = 0;
            sVar4 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::size
                              (&local_28), local_50 < sVar4; local_50 = local_50 + 1) {
          COLLADAFW::Formula::getMathmlAsts
                    ((Formula *)
                     (in_RDI->
                     super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                     )._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::operator[]
                    (&local_28,local_50);
          COLLADAFW::ArrayPrimitiveType<MathML::AST::INode_*>::append
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        }
      }
      else {
        pvVar5 = std::
                 stack<COLLADASaxFWL::Operator,_std::deque<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>_>
                 ::top((stack<COLLADASaxFWL::Operator,_std::deque<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>_>
                        *)0xb26afa);
        vVar1 = *pvVar5;
        std::
        stack<COLLADASaxFWL::Operator,_std::deque<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>_>
        ::pop((stack<COLLADASaxFWL::Operator,_std::deque<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>_>
               *)0xb26b1d);
        bVar3 = (*(code *)(in_RDI->
                          super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                          )._M_impl.super__Vector_impl_data._M_start[0x146])(in_RDI,vVar1);
        if ((bVar3 & 1) == 0) {
          if (vVar1 == USER_DEFINED_FUNCTION) {
            uVar6 = (*(code *)(in_RDI->
                              super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                              )._M_impl.super__Vector_impl_data._M_start[0x145])(in_RDI,&local_28);
            (*(code *)(in_RDI->
                      super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[0x147])(in_RDI,uVar6);
          }
          else if (sVar4 == 1) {
            uVar6 = (*(code *)(in_RDI->
                              super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                              )._M_impl.super__Vector_impl_data._M_start[0x13f])
                              (in_RDI,&local_28,vVar1);
            (*(code *)(in_RDI->
                      super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[0x147])(in_RDI,uVar6);
          }
          else {
            uVar6 = (*(code *)(in_RDI->
                              super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                              )._M_impl.super__Vector_impl_data._M_start[0x140])
                              (in_RDI,&local_28,vVar1);
            (*(code *)(in_RDI->
                      super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[0x147])(in_RDI,uVar6);
          }
        }
        else {
          in_stack_ffffffffffffff40 =
               (ArrayPrimitiveType<MathML::AST::INode_*> *)
               (*(code *)(in_RDI->
                         super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[0x144])(in_RDI,&local_28,vVar1);
          (*(code *)(in_RDI->
                    super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>)
                    ._M_impl.super__Vector_impl_data._M_start[0x147])
                    (in_RDI,in_stack_ffffffffffffff40);
        }
      }
      local_1 = 1;
    }
    std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::~vector
              ((vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *)
               in_stack_ffffffffffffff40);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool FormulasLoader::end__apply()
	{
		mCurrentApplyHasChild = true;

		if ( mNodeListStack.empty() )
		{
			// TODO error handling
			return false;
		}

		NodeVector nodes = mNodeListStack.top();
		mNodeListStack.pop();
		size_t numOfNodes = nodes.size();

		if ( numOfNodes == 0 )
		{
			// TODO error handling
			return false;
		}

		if ( mOperatorStack.empty() )
		{
			mCurrentFormula->getMathmlAsts().allocMemory( nodes.size() );
			for (size_t i=0; i<nodes.size(); ++i)
			{
				mCurrentFormula->getMathmlAsts().append( nodes[ i ] );
			}
		}
		else
		{
			Operator op = mOperatorStack.top();
			mOperatorStack.pop();

			if ( isFunction( op ) )
			{
				MathML::AST::INode* node = createFunctionOperation( nodes, op );
				appendNewNode( node );
			}
			else if ( op == USER_DEFINED_FUNCTION )
			{
				MathML::AST::INode* node = createUserDefinedFunctionOperation( nodes );
				appendNewNode( node );
			}
			else
			{
				switch ( numOfNodes )
				{

				case 1:
					{
						MathML::AST::INode* node = createUnaryOperation( nodes, op );
						appendNewNode( node );
						break;
					}
				default:
					{
						MathML::AST::INode* node = createMultiOperandOperation( nodes, op );
						appendNewNode( node );
						break;
					}
				}
			}
		}

		return true;
	}